

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void polyscope::buildSlicePlaneGUI(void)

{
  bool bVar1;
  reference ppSVar2;
  SlicePlane *s;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_> *__range2;
  ImVec2 *in_stack_ffffffffffffffc8;
  SlicePlane *in_stack_ffffffffffffffd0;
  __normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
  local_20;
  undefined1 *local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  ImGui::SetNextTreeNodeOpen(false,0x38a710);
  bVar1 = ImGui::TreeNode((char *)in_stack_ffffffffffffffc8);
  if (bVar1) {
    ImVec2::ImVec2(&local_8,0.0,0.0);
    bVar1 = ImGui::Button((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (bVar1) {
      addSceneSlicePlane();
    }
    ImGui::SameLine((float)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                    SUB84(in_stack_ffffffffffffffd0,0));
    ImVec2::ImVec2(&local_10,0.0,0.0);
    bVar1 = ImGui::Button((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (bVar1) {
      removeLastSceneSlicePlane();
    }
    local_18 = state::slicePlanes;
    local_20._M_current =
         (SlicePlane **)
         std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>::begin
                   ((vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_> *)
                    in_stack_ffffffffffffffc8);
    std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>::end
              ((vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_> *)
               in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
                               *)in_stack_ffffffffffffffd0,
                              (__normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
                ::operator*(&local_20);
      in_stack_ffffffffffffffd0 = *ppSVar2;
      SlicePlane::buildGUI(in_stack_ffffffffffffffd0);
      __gnu_cxx::
      __normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
      ::operator++(&local_20);
    }
    ImGui::TreePop();
  }
  return;
}

Assistant:

void buildSlicePlaneGUI() {

  ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
  if (ImGui::TreeNode("Slice Planes")) {
    if (ImGui::Button("Add plane")) {
      addSceneSlicePlane();
    }
    ImGui::SameLine();
    if (ImGui::Button("Remove plane")) {
      removeLastSceneSlicePlane();
    }
    for (SlicePlane* s : state::slicePlanes) {
      s->buildGUI();
    }
    ImGui::TreePop();
  }
}